

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O3

void __thiscall
TPZTensor<TFad<6,_double>_>::TPZDecomposed::ApplyStrainComputeElasticStress
          (TPZDecomposed *this,TPZTensor<TFad<6,_double>_> *Stress,REAL *K,REAL *G)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  TFad<6,_double> *pTVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  long lVar16;
  TFad<6,_double> *pTVar17;
  TFad<6,_double> *pTVar18;
  long lVar19;
  undefined1 auVar20 [16];
  double dVar21;
  TPZTensor<TFad<6,_double>_> SigVol;
  double local_348 [8];
  double local_308 [8];
  double local_2c8 [6];
  double adStack_298 [8];
  undefined1 auStack_258 [16];
  double adStack_248 [6];
  TFad<6,_double> local_218;
  undefined **local_1d8;
  TPZManVector<TFad<6,_double>,_6> local_1d0;
  
  pTVar6 = (this->fEigenvalues).super_TPZVec<TFad<6,_double>_>.fStore;
  local_2c8[4] = pTVar6->dx_[4];
  local_2c8[5] = pTVar6->dx_[5];
  local_2c8[2] = pTVar6->dx_[2];
  local_2c8[3] = pTVar6->dx_[3];
  local_2c8[0] = pTVar6->dx_[0];
  local_2c8[1] = pTVar6->dx_[1];
  dVar2 = pTVar6->val_;
  local_308[4] = pTVar6[1].dx_[4];
  local_308[5] = pTVar6[1].dx_[5];
  local_308[2] = pTVar6[1].dx_[2];
  local_308[3] = pTVar6[1].dx_[3];
  local_308[0] = pTVar6[1].dx_[0];
  local_308[1] = pTVar6[1].dx_[1];
  dVar3 = pTVar6[1].val_;
  local_348[4] = pTVar6[2].dx_[4];
  local_348[5] = pTVar6[2].dx_[5];
  local_348[2] = pTVar6[2].dx_[2];
  local_348[3] = pTVar6[2].dx_[3];
  local_348[0] = pTVar6[2].dx_[0];
  local_348[1] = pTVar6[2].dx_[1];
  dVar4 = pTVar6[2].val_;
  dVar21 = dVar2 + dVar3 + dVar4;
  lVar16 = 0;
  do {
    dVar10 = *(double *)((long)local_348 + lVar16 + 8) +
             *(double *)((long)local_308 + lVar16 + 8) +
             *(double *)((long)local_308 + lVar16 + 0x48);
    auVar20._8_4_ = SUB84(dVar10,0);
    auVar20._0_8_ =
         *(double *)((long)local_348 + lVar16) +
         *(double *)((long)local_308 + lVar16) + *(double *)((long)local_308 + lVar16 + 0x40);
    auVar20._12_4_ = (int)((ulong)dVar10 >> 0x20);
    *(undefined1 (*) [16])((long)adStack_248 + lVar16) = auVar20;
    lVar16 = lVar16 + 0x10;
  } while (lVar16 != 0x30);
  dVar10 = dVar21 / 3.0;
  lVar16 = 2;
  do {
    auVar20 = divpd(*(undefined1 (*) [16])(auStack_258 + lVar16 * 8),_DAT_01501610);
    *(undefined1 (*) [16])(adStack_298 + lVar16) = auVar20;
    lVar16 = lVar16 + 2;
  } while (lVar16 != 8);
  local_1d8 = &PTR__TPZTensor_018777a0;
  local_218.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_01835938;
  local_218.val_ = 0.0;
  local_218.dx_[0] = 0.0;
  local_218.dx_[1] = 0.0;
  local_218.dx_[2] = 0.0;
  local_218.dx_[3] = 0.0;
  local_218.dx_[4] = 0.0;
  local_218.dx_[5] = 0.0;
  TPZManVector<TFad<6,_double>,_6>::TPZManVector(&local_1d0,6,&local_218);
  dVar5 = *K;
  pdVar1 = local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_;
  lVar16 = 0;
  do {
    auVar11._8_4_ = SUB84(adStack_248[lVar16 + 1] * dVar5,0);
    auVar11._0_8_ = adStack_248[lVar16] * dVar5;
    auVar11._12_4_ = (int)((ulong)(adStack_248[lVar16 + 1] * dVar5) >> 0x20);
    *(undefined1 (*) [16])(pdVar1 + lVar16) = auVar11;
    lVar16 = lVar16 + 2;
  } while (lVar16 != 6);
  dVar21 = dVar21 * dVar5;
  local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[5].val_ = dVar21;
  dVar5 = local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[1];
  dVar12 = local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[2];
  dVar13 = local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[3];
  dVar14 = local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[4];
  dVar15 = local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[5];
  local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[3].dx_[0] = *pdVar1;
  local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[3].dx_[1] = dVar5;
  local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[3].dx_[2] = dVar12;
  local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[3].dx_[3] = dVar13;
  local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[3].dx_[4] = dVar14;
  local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[3].dx_[5] = dVar15;
  local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[3].val_ = dVar21;
  dVar5 = local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[1];
  dVar12 = local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[2];
  dVar13 = local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[3];
  dVar14 = local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[4];
  dVar15 = local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[5].dx_[5];
  (local_1d0.super_TPZVec<TFad<6,_double>_>.fStore)->dx_[0] = *pdVar1;
  (local_1d0.super_TPZVec<TFad<6,_double>_>.fStore)->dx_[1] = dVar5;
  (local_1d0.super_TPZVec<TFad<6,_double>_>.fStore)->dx_[2] = dVar12;
  (local_1d0.super_TPZVec<TFad<6,_double>_>.fStore)->dx_[3] = dVar13;
  (local_1d0.super_TPZVec<TFad<6,_double>_>.fStore)->dx_[4] = dVar14;
  (local_1d0.super_TPZVec<TFad<6,_double>_>.fStore)->dx_[5] = dVar15;
  (local_1d0.super_TPZVec<TFad<6,_double>_>.fStore)->val_ = dVar21;
  pTVar6 = (Stress->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  lVar16 = 2;
  do {
    auVar7._8_4_ = SUB84(local_308[lVar16 + 7] - adStack_298[lVar16 + 1],0);
    auVar7._0_8_ = local_308[lVar16 + 6] - adStack_298[lVar16];
    auVar7._12_4_ = (int)((ulong)(local_308[lVar16 + 7] - adStack_298[lVar16 + 1]) >> 0x20);
    *(undefined1 (*) [16])(pTVar6->dx_ + lVar16 + -2) = auVar7;
    lVar16 = lVar16 + 2;
  } while (lVar16 != 8);
  pTVar6->val_ = dVar2 - dVar10;
  lVar16 = 0;
  do {
    auVar8._8_4_ = SUB84(local_308[lVar16 + 1] - adStack_298[lVar16 + 3],0);
    auVar8._0_8_ = local_308[lVar16] - adStack_298[lVar16 + 2];
    auVar8._12_4_ = (int)((ulong)(local_308[lVar16 + 1] - adStack_298[lVar16 + 3]) >> 0x20);
    *(undefined1 (*) [16])(pTVar6[3].dx_ + lVar16) = auVar8;
    lVar16 = lVar16 + 2;
  } while (lVar16 != 6);
  pTVar6[3].val_ = dVar3 - dVar10;
  lVar16 = 0;
  do {
    auVar9._8_4_ = SUB84(local_348[lVar16 + 1] - adStack_298[lVar16 + 3],0);
    auVar9._0_8_ = local_348[lVar16] - adStack_298[lVar16 + 2];
    auVar9._12_4_ = (int)((ulong)(local_348[lVar16 + 1] - adStack_298[lVar16 + 3]) >> 0x20);
    *(undefined1 (*) [16])(pTVar6[5].dx_ + lVar16) = auVar9;
    lVar16 = lVar16 + 2;
  } while (lVar16 != 6);
  pTVar6[5].val_ = dVar4 - dVar10;
  local_218.val_ = *G + *G;
  local_218.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_01835938;
  local_218.dx_[0] = 0.0;
  local_218.dx_[1] = 0.0;
  local_218.dx_[2] = 0.0;
  local_218.dx_[3] = 0.0;
  local_218.dx_[4] = 0.0;
  local_218.dx_[5] = 0.0;
  TPZTensor<TFad<6,_double>_>::operator*=(Stress,&local_218);
  pTVar6 = (Stress->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  lVar16 = 0;
  pTVar17 = local_1d0.super_TPZVec<TFad<6,_double>_>.fStore;
  pTVar18 = pTVar6;
  do {
    lVar19 = 2;
    do {
      pTVar18->dx_[lVar19 + -2] = pTVar17->dx_[lVar19 + -2] + pTVar18->dx_[lVar19 + -2];
      lVar19 = lVar19 + 1;
    } while (lVar19 != 8);
    pTVar6[lVar16].val_ =
         local_1d0.super_TPZVec<TFad<6,_double>_>.fStore[lVar16].val_ + pTVar6[lVar16].val_;
    lVar16 = lVar16 + 1;
    pTVar18 = pTVar18 + 1;
    pTVar17 = pTVar17 + 1;
  } while (lVar16 != 6);
  local_1d8 = &PTR__TPZTensor_018777a0;
  TPZManVector<TFad<6,_double>,_6>::~TPZManVector(&local_1d0);
  return;
}

Assistant:

void ApplyStrainComputeElasticStress(TPZTensor<T> &Stress, REAL &K, REAL & G) {
            const T sig1 = this->fEigenvalues[0];
            const T sig2 = this->fEigenvalues[1];
            const T sig3 = this->fEigenvalues[2];
            const T trace = sig1 + sig2 + sig3;
            const T trace_3 = trace / 3.;

            TPZTensor<T> SigVol;
            SigVol.XX() = SigVol.YY() = SigVol.ZZ() = K * trace;

            Stress.XX() = sig1 - trace_3;
            Stress.YY() = sig2 - trace_3;
            Stress.ZZ() = sig3 - trace_3;
            Stress *= (2 * G);
            Stress += SigVol;
        }